

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdProc.c
# Opt level: O2

void Dsd_Decompose(Dsd_Manager_t *pDsdMan,DdNode **pbFuncs,int nFuncs)

{
  int iVar1;
  bool bVar2;
  DdNode **ppDVar3;
  uint n;
  int iVar4;
  uint uVar5;
  Dsd_Node_t **ppDVar6;
  Dsd_Node_t *pDVar7;
  int *piVar8;
  abctime aVar9;
  uint uVar10;
  ulong uVar11;
  uint local_74;
  int MaxBlock;
  int nCascades;
  DdNode **local_68;
  uint local_5c;
  uint local_58;
  uint local_54;
  DdManager *local_50;
  abctime local_48;
  ulong local_40;
  abctime local_38;
  
  local_50 = pDsdMan->dd;
  local_68 = pbFuncs;
  if (pDsdMan->nRootsAlloc < nFuncs) {
    if (0 < pDsdMan->nRootsAlloc) {
      free(pDsdMan->pRoots);
    }
    pDsdMan->nRootsAlloc = nFuncs;
    ppDVar6 = (Dsd_Node_t **)malloc((long)nFuncs << 3);
    pDsdMan->pRoots = ppDVar6;
  }
  if (pDsdMan->fVerbose != 0) {
    puts("\nDecomposability statistics for individual outputs:");
  }
  s_nDecBlocks = 0;
  local_48 = Abc_Clock();
  pDsdMan->nRoots = 0;
  s_nCascades = 0;
  local_40 = 0;
  if (0 < nFuncs) {
    local_40 = (ulong)(uint)nFuncs;
  }
  uVar11 = 0;
  uVar5 = 0;
  local_74 = 0;
  uVar10 = 0;
  local_5c = nFuncs;
  do {
    n = local_5c;
    if (local_40 == uVar11) {
      if (pDsdMan->nRoots == local_5c) {
        if (pDsdMan->fVerbose != 0) {
          putchar(10);
          puts("The cumulative decomposability statistics:");
          printf("  Total outputs                             = %5d\n",(ulong)n);
          printf("  Decomposable outputs                      = %5d\n",(ulong)local_74);
          printf("  Completely decomposable outputs           = %5d\n",(ulong)uVar5);
          printf("  The sum of max gate sizes                 = %5d\n",(ulong)uVar10);
          uVar10 = Cudd_SharingSize(local_68,n);
          printf("  Shared BDD size                           = %5d\n",(ulong)uVar10);
          printf("  Decomposition entries                     = %5d\n",
                 (ulong)(uint)pDsdMan->Table->num_entries);
          aVar9 = Abc_Clock();
          printf("  Pure decomposition time                   =  %.2f sec\n",
                 (double)((float)(aVar9 - local_48) / 1e+06));
        }
        return;
      }
      __assert_fail("pDsdMan->nRoots == nFuncs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/dsd/dsdProc.c"
                    ,0xc2,"void Dsd_Decompose(Dsd_Manager_t *, DdNode **, int)");
    }
    local_38 = Abc_Clock();
    pDVar7 = dsdKernelDecompose_rec(pDsdMan,local_68[uVar11]);
    iVar1 = pDsdMan->nRoots;
    pDsdMan->nRoots = iVar1 + 1;
    pDsdMan->pRoots[iVar1] = pDVar7;
    Dsd_TreeNodeGetInfoOne(pDsdMan->pRoots[uVar11],&nCascades,&MaxBlock);
    if (s_nCascades < nCascades) {
      s_nCascades = nCascades;
    }
    piVar8 = (int *)((ulong)pDsdMan->pRoots[uVar11] & 0xfffffffffffffffe);
    local_54 = uVar5;
    if (*piVar8 == 5) {
      iVar1 = piVar8[9];
      iVar4 = Extra_bddSuppSize(local_50,*(DdNode **)(piVar8 + 4));
      if (iVar4 != (short)iVar1) goto LAB_00676796;
    }
    else {
LAB_00676796:
      local_74 = local_74 + 1;
    }
    iVar1 = MaxBlock;
    bVar2 = MaxBlock < 3;
    if (pDsdMan->fVerbose != 0) {
      printf("#%02d: ",uVar11 & 0xffffffff);
      ppDVar3 = local_68;
      local_58 = uVar10;
      uVar10 = Cudd_SupportSize(local_50,local_68[uVar11]);
      printf("Ins=%2d. ",(ulong)uVar10);
      uVar10 = Dsd_TreeCountNonTerminalNodesOne(pDsdMan->pRoots[uVar11]);
      printf("Gts=%3d. ",(ulong)uVar10);
      uVar10 = Dsd_TreeCountPrimeNodesOne(pDsdMan->pRoots[uVar11]);
      printf("Pri=%3d. ",(ulong)uVar10);
      printf("Max=%3d. ",(ulong)(uint)MaxBlock);
      printf("Reuse=%2d. ",0);
      printf("Csc=%2d. ",(ulong)(uint)nCascades);
      aVar9 = Abc_Clock();
      printf("T= %.2f s. ",(double)((float)(aVar9 - local_38) / 1e+06));
      uVar10 = local_58;
      uVar5 = Cudd_DagSize(ppDVar3[uVar11]);
      printf("Bdd=%2d. ",(ulong)uVar5);
      putchar(10);
      fflush(_stdout);
    }
    uVar5 = local_54 + bVar2;
    uVar10 = uVar10 + iVar1;
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

void Dsd_Decompose( Dsd_Manager_t * pDsdMan, DdNode ** pbFuncs, int nFuncs )
{
    DdManager * dd = pDsdMan->dd;
    int i;
    abctime clk;
    Dsd_Node_t * pTemp;
    int SumMaxGateSize = 0;
    int nDecOutputs = 0;
    int nCBFOutputs = 0;
/*
s_Loops1 = 0;
s_Loops2 = 0;
s_Loops3 = 0;
s_Case4Calls = 0;
s_Case4CallsSpecial = 0;
s_Case5 = 0;
s_Loops2Useless = 0;
*/
    // resize the number of roots in the manager
    if ( pDsdMan->nRootsAlloc < nFuncs )
    {
        if ( pDsdMan->nRootsAlloc > 0 )
            ABC_FREE( pDsdMan->pRoots );
        pDsdMan->nRootsAlloc = nFuncs;
        pDsdMan->pRoots = (Dsd_Node_t **) ABC_ALLOC( char, pDsdMan->nRootsAlloc * sizeof(Dsd_Node_t *) );
    }

    if ( pDsdMan->fVerbose )
        printf( "\nDecomposability statistics for individual outputs:\n" );

    // set the counter of decomposition nodes
    s_nDecBlocks = 0;

    // perform decomposition for all outputs
    clk = Abc_Clock();
    pDsdMan->nRoots = 0;
    s_nCascades = 0;
    for ( i = 0; i < nFuncs; i++ )
    {
        int nLiteralsPrev;
        int nDecBlocksPrev;
        int nExorGatesPrev;
        int nReusedBlocksPres;
        int nCascades;
        int MaxBlock;
        int nPrimeBlocks;
        abctime clk;

        clk = Abc_Clock();
        nLiteralsPrev     = s_nLiterals;
        nDecBlocksPrev    = s_nDecBlocks;
        nExorGatesPrev    = s_nExorGates;
        nReusedBlocksPres = s_nReusedBlocks;
        nPrimeBlocks      = s_nPrimeBlocks;

        pDsdMan->pRoots[ pDsdMan->nRoots++ ] = dsdKernelDecompose_rec( pDsdMan, pbFuncs[i] );

        Dsd_TreeNodeGetInfoOne( pDsdMan->pRoots[i], &nCascades, &MaxBlock );
        s_nCascades = ddMax( s_nCascades, nCascades );
        pTemp = Dsd_Regular(pDsdMan->pRoots[i]);
        if ( pTemp->Type != DSD_NODE_PRIME || pTemp->nDecs != Extra_bddSuppSize(dd,pTemp->S) )
            nDecOutputs++;
        if ( MaxBlock < 3 )
            nCBFOutputs++;
        SumMaxGateSize += MaxBlock;

        if ( pDsdMan->fVerbose )
        {
            printf("#%02d: ", i );                              
            printf("Ins=%2d. ", Cudd_SupportSize(dd,pbFuncs[i]) );                  
            printf("Gts=%3d. ", Dsd_TreeCountNonTerminalNodesOne( pDsdMan->pRoots[i] ) ); 
            printf("Pri=%3d. ", Dsd_TreeCountPrimeNodesOne( pDsdMan->pRoots[i] ) ); 
            printf("Max=%3d. ", MaxBlock ); 
            printf("Reuse=%2d. ", s_nReusedBlocks-nReusedBlocksPres ); 
            printf("Csc=%2d. ", nCascades ); 
            printf("T= %.2f s. ", (float)(Abc_Clock()-clk)/(float)(CLOCKS_PER_SEC) ) ;
            printf("Bdd=%2d. ", Cudd_DagSize(pbFuncs[i]) ); 
            printf("\n");
            fflush( stdout );
        }
    }
    assert( pDsdMan->nRoots == nFuncs );

    if ( pDsdMan->fVerbose )
    {
        printf( "\n" );
        printf( "The cumulative decomposability statistics:\n" );
        printf( "  Total outputs                             = %5d\n", nFuncs );
        printf( "  Decomposable outputs                      = %5d\n", nDecOutputs );
        printf( "  Completely decomposable outputs           = %5d\n", nCBFOutputs );
        printf( "  The sum of max gate sizes                 = %5d\n", SumMaxGateSize );
        printf( "  Shared BDD size                           = %5d\n", Cudd_SharingSize( pbFuncs, nFuncs ) );
        printf( "  Decomposition entries                     = %5d\n", st__count( pDsdMan->Table ) );
        printf( "  Pure decomposition time                   =  %.2f sec\n", (float)(Abc_Clock() - clk)/(float)(CLOCKS_PER_SEC) );
    }
/*
    printf( "s_Loops1 = %d.\n", s_Loops1 );
    printf( "s_Loops2 = %d.\n", s_Loops2 );
    printf( "s_Loops3 = %d.\n", s_Loops3 );
    printf( "s_Case4Calls = %d.\n", s_Case4Calls );
    printf( "s_Case4CallsSpecial = %d.\n", s_Case4CallsSpecial );
    printf( "s_Case5 = %d.\n", s_Case5 );
    printf( "s_Loops2Useless = %d.\n", s_Loops2Useless );
*/
}